

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O1

int32_t MsgHelper::serializeMsg(PipeMsg *msg,uint8_t *buf)

{
  uint uVar1;
  uint uVar2;
  int32_t iVar3;
  uint32_t value;
  
  *buf = msg->type;
  switch(msg->type) {
  case C2S_REQUEST:
    buf[1] = (msg->field_1).c2s_request.CMD;
    iVar3 = serializeAddr(&(msg->field_1).c2s_request.ADDR,buf + 2);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/PipeMsg.cpp"
                    ,0x3f,"static int32_t MsgHelper::serializeMsg(const PipeMsg *, uint8_t *)");
    }
    value = iVar3 + 2;
    break;
  case S2C_RESPONSE:
    buf[1] = (msg->field_1).c2s_request.CMD;
    value = 2;
    break;
  case SEND_TCP_DATA:
    buf[1] = (uint8_t)(msg->field_1).c2s_request.ADDR.PORT;
    uVar2 = (msg->field_1).common_tcp_data.LEN;
    value = uVar2 + 6;
    writeUint32InBigEndian(buf + 2,value);
    memcpy(buf + 6,(msg->field_1).common_tcp_data.DATA,(ulong)uVar2);
    break;
  case C2S_UDP_DATA:
  case S2C_UDP_DATA:
    buf[1] = (uint8_t)(msg->field_1).c2s_request.ADDR.PORT;
    uVar2 = serializeAddr((S5AddrInfo *)((msg->field_1).c2s_request.ADDR.ADDR + 10),buf + 6);
    if (uVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/PipeMsg.cpp"
                    ,0x5d,"static int32_t MsgHelper::serializeMsg(const PipeMsg *, uint8_t *)");
    }
    uVar1 = (msg->field_1).common_tcp_data.LEN;
    value = uVar2 + uVar1 + 6;
    memcpy(buf + (ulong)uVar2 + 6,(msg->field_1).common_tcp_data.DATA,(ulong)uVar1);
    writeUint32InBigEndian(buf + 2,value);
    break;
  case S2C_DISCONNECT:
  case S2C_CANNOT_RESOLVE_ADDR:
    value = 1;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/PipeMsg.cpp"
                  ,0x74,"static int32_t MsgHelper::serializeMsg(const PipeMsg *, uint8_t *)");
  }
  return value;
}

Assistant:

int32_t MsgHelper::serializeMsg(const PipeMsg *msg, uint8_t *buf)
{
	buf[0] = msg->type;
	switch(msg->type)
	{
		case PIPEMSG_TYPE::C2S_REQUEST:
		{
			buf[1] = msg->c2s_request.CMD;

			auto len = serializeAddr(&msg->c2s_request.ADDR, buf + 2);
			if(len <= 0)
			{
				assert(0);
				return SERIALIZE_FAIL;
			}
			return 2 + len;
		}break;
		case PIPEMSG_TYPE::S2C_RESPONSE:
		{
			buf[1] = (uint8_t)msg->s2c_response.CODE;
			return 2;
		}break;
		case PIPEMSG_TYPE::SEND_TCP_DATA:
		{
			buf[1] = msg->common_tcp_data.METHOD;

			uint32_t dataLen = msg->common_tcp_data.LEN;
			uint32_t msgLen = dataLen + 6;

			writeUint32InBigEndian(&buf[2], msgLen);
			memcpy(&buf[6], msg->common_tcp_data.DATA, dataLen);

			return msgLen;

		}break;
		case PIPEMSG_TYPE::C2S_UDP_DATA:
		case PIPEMSG_TYPE::S2C_UDP_DATA:
		{
			buf[1] = msg->common_udp_data.METHOD;
			auto len = serializeAddr(&msg->common_udp_data.ADDR, buf + 6);
			if(len <= 0)
			{
				assert(0);
				return SERIALIZE_FAIL;
			}

			auto dataLen = msg->common_udp_data.LEN;
			uint32_t msgLen = 6 + len + dataLen;

			// DATA
			memcpy(&buf[6 + len], msg->common_udp_data.DATA, dataLen);
			// LEN
			writeUint32InBigEndian(&buf[2], msgLen);

			return msgLen;
		}break;
		case PIPEMSG_TYPE::S2C_DISCONNECT:
		{
			return 1;
		}break;
		case PIPEMSG_TYPE::S2C_CANNOT_RESOLVE_ADDR:
		{
			return 1;
		}break;
	}
	assert(0);
	return SERIALIZE_FAIL;
}